

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_delay.cpp
# Opt level: O3

void __thiscall tst_qpromise_delay::fulfilledStdChrono(tst_qpromise_delay *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar3;
  PromiseData<int> *this_00;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar4;
  _func_int **pp_Var5;
  PromiseResolver<void> PVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  PromiseDataBase<void,_void_()> *this_01;
  PromiseData<int> *pPVar10;
  char *pcVar11;
  char *pcVar12;
  QPromiseReject<int> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_168;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QStack_160;
  _func_int **local_158;
  PromiseData<int> *pPStack_150;
  PromiseData<int> *local_148;
  QPromise<int> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_130;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_128;
  PromiseResolver<int> resolver_1;
  QPromise<int> local_118;
  function<void_()> local_108;
  QSharedData *local_e0;
  _func_int **local_d8;
  QPromiseBase<int> local_d0;
  qint64 elapsed;
  QPromiseBase<int> local_b8;
  PromiseResolver<void> resolver;
  _Manager_type local_98;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  undefined4 local_44;
  QElapsedTimer timer;
  
  timer.t1 = -0x8000000000000000;
  timer.t2 = -0x8000000000000000;
  elapsed = -1;
  QElapsedTimer::start();
  local_44 = 0x2a;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            (&local_b8,(anon_class_8_1_a8c68091)&local_44);
  local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011aa98;
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&local_d0,(anon_class_4_1_898ef5c2)(int)&local_b8);
  if (local_d0.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_d0.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_148 = local_d0.m_d.d;
  this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011acb8;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011ac50;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_e0 = &this_01->super_QSharedData;
  local_108.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011abe8;
  local_108.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_108);
  local_108.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011ac30;
  if ((PromiseDataBase<void,_void_()> *)local_108.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_108.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_108.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_108.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar6.m_d.d = resolver.m_d.d;
  local_d8 = (_func_int **)&PTR__QPromiseBase_0011aa98;
  if (resolver.m_d.d == (Data *)0x0) {
    local_168.d = (Data *)0x0;
LAB_00105745:
    QStack_160.d = (Data *)0x0;
    bVar7 = true;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) {
      local_168 = resolver.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_00105745;
    }
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_168 = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    QStack_160 = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar7 = false;
  }
  QVar3.d = QStack_160.d;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_158 = (_func_int **)&elapsed;
  pPStack_150 = (PromiseData<int> *)&timer;
  local_68._M_unused._M_object = operator_new(0x20);
  *(Data **)local_68._M_unused._0_8_ = local_168.d;
  if (local_168.d != (Data *)0x0) {
    LOCK();
    ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_68._M_unused._0_8_ + 8) = QStack_160.d;
  if (QStack_160.d == (Data *)0x0) {
    *(_func_int ***)((long)local_68._M_unused._0_8_ + 0x10) = local_158;
    *(PromiseData<int> **)((long)local_68._M_unused._0_8_ + 0x18) = pPStack_150;
    pcStack_50 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(_func_int ***)((long)local_68._M_unused._0_8_ + 0x10) = local_158;
    *(PromiseData<int> **)((long)local_68._M_unused._0_8_ + 0x18) = pPStack_150;
    pcStack_50 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    if (QStack_160.d != (Data *)0x0) {
      LOCK();
      ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QStack_160.d,0x10);
      }
    }
  }
  if (local_168.d != (Data *)0x0) {
    LOCK();
    ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_168.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&local_148->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  local_168 = PVar6.m_d.d;
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
    UNLOCK();
  }
  if (!bVar7) {
    LOCK();
    ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  QStack_160.d = QVar3.d;
  local_158 = (_func_int **)&elapsed;
  pPStack_150 = (PromiseData<int> *)&timer;
  local_88._M_unused._M_object = operator_new(0x20);
  pp_Var5 = local_d8;
  *(Data **)local_88._M_unused._0_8_ = local_168.d;
  if (local_168.d != (Data *)0x0) {
    LOCK();
    ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_88._M_unused._0_8_ + 8) = QStack_160.d;
  if (QStack_160.d == (Data *)0x0) {
    *(_func_int ***)((long)local_88._M_unused._0_8_ + 0x10) = local_158;
    *(PromiseData<int> **)((long)local_88._M_unused._0_8_ + 0x18) = pPStack_150;
    pcStack_70 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(_func_int ***)((long)local_88._M_unused._0_8_ + 0x10) = local_158;
    *(PromiseData<int> **)((long)local_88._M_unused._0_8_ + 0x18) = pPStack_150;
    pcStack_70 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    if (QStack_160.d != (Data *)0x0) {
      LOCK();
      ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QStack_160.d,0x10);
      }
    }
  }
  this_00 = local_148;
  if (local_168.d != (Data *)0x0) {
    LOCK();
    ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_168.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&this_00->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (!bVar7) {
    LOCK();
    ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar3.d,0x10);
    }
  }
  if (PVar6.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar6.m_d.d == 0) {
      operator_delete((void *)PVar6.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&this_00->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar7) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&this_00->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011aa68;
  pPVar10 = (PromiseData<int> *)operator_new(0x68);
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0011ab48;
  QReadWriteLock::QReadWriteLock
            (&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0011aad0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar10 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118.super_QPromiseBase<int>._vptr_QPromiseBase = pp_Var5;
  p.super_QPromiseBase<int>.m_d.d = pPVar10;
  local_118.super_QPromiseBase<int>.m_d.d = pPVar10;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,&local_118);
  local_118.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011aa68;
  if (local_118.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((local_118.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_118.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_118.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_128.d = (Data *)0x0;
    local_130.d = (Data *)0x0;
    goto LAB_00105b7b;
  }
  LOCK();
  *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
  UNLOCK();
  local_128 = resolver_1.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_130.d = (Data *)0x0;
LAB_00105b66:
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    if (local_130.d == (Data *)0x0) goto LAB_00105b7b;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_130 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) goto LAB_00105b66;
  }
  LOCK();
  ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
LAB_00105b7b:
  pPStack_150 = this_00;
  LOCK();
  pQVar2 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_158 = pp_Var5;
  local_108.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_108.super__Function_base._M_functor._8_8_ = 0;
  local_108.super__Function_base._M_manager = (_Manager_type)0x0;
  local_108._M_invoker = (_Invoker_type)0x0;
  local_168.d = (Data *)local_128.d;
  QStack_160.d = (Data *)local_130.d;
  local_108.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(Data **)local_108.super__Function_base._M_functor._M_unused._0_8_ = local_168.d;
  if ((Data *)local_168.d != (Data *)0x0) {
    LOCK();
    ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_108.super__Function_base._M_functor._M_unused._0_8_ + 8) = QStack_160.d;
  if ((Data *)QStack_160.d != (Data *)0x0) {
    LOCK();
    ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_108.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_0011aa68;
  *(PromiseData<int> **)((long)local_108.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       pPStack_150;
  if (pPStack_150 == (PromiseData<int> *)0x0) {
    *(_func_int ***)((long)local_108.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         pp_Var5;
    local_108._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_invoke;
    local_108.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_manager;
    local_158 = (_func_int **)&PTR__QPromiseBase_0011aa68;
  }
  else {
    LOCK();
    pQVar2 = &(pPStack_150->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(_func_int ***)((long)local_108.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         pp_Var5;
    local_108._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_invoke;
    local_108.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_manager;
    local_158 = (_func_int **)&PTR__QPromiseBase_0011aa68;
    if (pPStack_150 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar2 = &(pPStack_150->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (pPStack_150 != (PromiseData<int> *)0x0)) {
        (*(pPStack_150->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
      }
    }
  }
  if ((Data *)QStack_160.d != (Data *)0x0) {
    LOCK();
    ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QStack_160.d,0x10);
    }
  }
  if ((Data *)local_168.d != (Data *)0x0) {
    LOCK();
    ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_168.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_168.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler(this_01,&local_108);
  if (local_108.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_108.super__Function_base._M_manager)
              ((_Any_data *)&local_108,(_Any_data *)&local_108,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_128,
             (QPromiseResolve<int> *)&local_130,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_01,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  if (local_98 != (_Manager_type)0x0) {
    (*local_98)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  }
  if (local_130.d != (Data *)0x0) {
    LOCK();
    ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_130.d,0x10);
    }
  }
  if (local_128.d != (Data *)0x0) {
    LOCK();
    ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_128.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = pp_Var5;
  bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_01);
  if (!bVar7) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (local_e0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_e0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_e0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  local_d0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011aa68;
  if (local_d0.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_d0.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_d0.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_d0.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                ();
    }
  }
  local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011aa68;
  if (local_b8.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_b8.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_b8.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_b8.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                ();
    }
  }
  iVar9 = waitForValue<int>(&p,(int *)0xffffffff);
  cVar8 = QTest::qCompare(iVar9,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                          ,0x4e);
  QVar4 = p.super_QPromiseBase<int>.m_d;
  if (cVar8 == '\0') {
    if (p.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
      return;
    }
  }
  else {
    bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar7 = (bool)(~bVar7 & ((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                            m_data._M_exception_object == (void *)0x0);
    local_168.d._0_1_ = bVar7;
    local_118.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(local_118.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,1);
    pcVar11 = QTest::toString<bool>((bool *)&local_168);
    pcVar12 = QTest::toString<bool>((bool *)&local_118);
    cVar8 = QTest::compare_helper
                      (bVar7,"Compared values are not the same",pcVar11,pcVar12,"p.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                       ,0x4f);
    if ((cVar8 != '\0') &&
       (cVar8 = QTest::qVerify(0x3ab < elapsed,"elapsed >= static_cast<qint64>(1000 * 0.94)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                               ,0x54), cVar8 != '\0')) {
      QTest::qVerify(elapsed < 0x425,"elapsed <= static_cast<qint64>(1000 * 1.06)","",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                     ,0x55);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011aa68;
  LOCK();
  pQVar1 = &((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
    (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
      _vptr_PromiseDataBase[1])();
  }
  return;
}

Assistant:

void tst_qpromise_delay::fulfilledStdChrono()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;

    timer.start();

    auto p = QtPromise::QPromise<int>::resolve(42).delay(std::chrono::seconds{1}).finally([&]() {
        elapsed = timer.elapsed();
    });

    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(p.isFulfilled(), true);

    // Qt::CoarseTimer (default) Coarse timers try to
    // keep accuracy within 5% of the desired interval.
    // Require accuracy within 6% for passing the test.
    QVERIFY(elapsed >= static_cast<qint64>(1000 * 0.94));
    QVERIFY(elapsed <= static_cast<qint64>(1000 * 1.06));
}